

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageControl::mousePressEvent(PageControl *this,QMouseEvent *e)

{
  int iVar1;
  QPoint QVar2;
  
  iVar1 = *(int *)(e + 0x40);
  if (iVar1 == 1) {
    ((this->d).d)->leftButtonPressed = true;
    QVar2 = QMouseEvent::pos(e);
    ((this->d).d)->clickPos = QVar2;
  }
  e[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
PageControl::mousePressEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		d->leftButtonPressed = true;

		d->clickPos = e->pos();

		e->accept();
	}
	else
		e->ignore();
}